

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O0

void update_explode(void)

{
  EXPLOSION *pEVar1;
  EXPLOSION *tmp;
  EXPLOSION *e;
  EXPLOSION **p;
  EXPLOSION *local_10;
  EXPLOSION **local_8;
  
  local_8 = &explosions;
  local_10 = explosions;
  while (local_10 != (EXPLOSION *)0x0) {
    local_10->time = local_10->time + 1.0 / ((float)local_10->big / 2.0 + 1.0);
    if (local_10->time <= 32.0) {
      local_8 = &local_10->next;
      local_10 = local_10->next;
    }
    else {
      *local_8 = local_10->next;
      pEVar1 = local_10->next;
      free(local_10);
      local_10 = pEVar1;
    }
  }
  return;
}

Assistant:

void update_explode()
{
   EXPLOSION **p = &explosions;
   EXPLOSION *e = explosions;
   EXPLOSION *tmp;

   while (e) {
      e->time += 1.0 / (e->big/2.0 + 1);

      if (e->time > 32) {
	 *p = e->next;
	 tmp = e;
	 e = e->next;
	 free(tmp);
      }
      else {
	 p = &e->next;
	 e = e->next;
      }
   }
}